

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::Distance> *
metaf::Distance::fromMileString
          (optional<metaf::Distance> *__return_storage_ptr__,string *s,bool remarkFormat)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Modifier MVar16;
  ulong uVar17;
  bool bVar18;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::
                                    unitStr_abi_cxx11_), iVar12 != 0)) {
    fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_._M_dataplus._M_p =
         (pointer)&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,"SM",
               "");
    __cxa_atexit(std::__cxx11::string::~string,
                 &fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_);
  }
  if (fromMileString(std::__cxx11::string_const&,bool)::unitLength == '\0') {
    fromMileString();
  }
  if (remarkFormat) {
    if (s->_M_string_length == 0) goto LAB_001a853e;
  }
  else {
    if (s->_M_string_length < fromMileString::unitLength + 1) goto LAB_001a853e;
    iVar12 = std::__cxx11::string::compare((char *)s);
    if (iVar12 == 0) {
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = (_Optional_payload_base<unsigned_int>)0x0;
      goto LAB_001a8492;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    if (local_48 ==
        fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_._M_string_length) {
      if (local_48 == 0) {
        bVar18 = false;
      }
      else {
        iVar12 = bcmp(local_50,fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_.
                               _M_dataplus._M_p,local_48);
        bVar18 = iVar12 != 0;
      }
    }
    else {
      bVar18 = true;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar18) goto LAB_001a853e;
  }
  cVar1 = *(s->_M_dataplus)._M_p;
  if (cVar1 == 'M') {
    MVar16 = LESS_THAN;
LAB_001a8373:
    bVar11 = 1;
  }
  else {
    bVar11 = 0;
    MVar16 = NONE;
    if (cVar1 == 'P') {
      MVar16 = MORE_THAN;
      goto LAB_001a8373;
    }
  }
  lVar4 = std::__cxx11::string::find((char)s,0x2f);
  if (lVar4 == -1) {
    uVar5 = (ulong)bVar11;
    uVar13 = s->_M_string_length;
    sVar7 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar7 = 0;
    }
    uVar10 = uVar13 - (sVar7 + uVar5);
    if (((uVar10 == 0 || 2 < uVar10) || (uVar13 == 0)) || (uVar13 < uVar10 + uVar5))
    goto LAB_001a853e;
    uVar13 = 0;
    iVar12 = 0;
    do {
      bVar11 = (s->_M_dataplus)._M_p[uVar13 + uVar5] - 0x30;
      if (9 < bVar11) goto LAB_001a853e;
      iVar12 = (uint)bVar11 + iVar12 * 10;
      uVar13 = uVar13 + 1;
    } while ((uVar13 & 0xffffffff) < uVar10);
    uVar3 = iVar12 * 10000;
  }
  else {
    uVar13 = (ulong)bVar11;
    sVar7 = fromMileString::unitLength;
    if (remarkFormat) {
      sVar7 = 0;
    }
    lVar9 = s->_M_string_length - uVar13;
    lVar4 = lVar9 - sVar7;
    if (s->_M_string_length < uVar13 + lVar4) {
      lVar4 = lVar9;
    }
    uVar5 = std::__cxx11::string::find((char)s,0x2f);
    if ((uVar5 == 0xffffffffffffffff) || (2 < uVar5 - uVar13 || uVar5 == uVar13)) {
LAB_001a853e:
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
      *(undefined4 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
      return __return_storage_ptr__;
    }
    uVar17 = lVar4 + uVar13;
    uVar10 = uVar17 - (uVar5 + 1);
    if ((uVar17 == uVar5 + 1) || (2 < uVar10)) goto LAB_001a853e;
    uVar2 = s->_M_string_length;
    uVar8 = 0;
    if (uVar5 <= uVar2 && uVar2 != 0) {
      uVar14 = 0x100000000;
      uVar15 = 0;
      do {
        cVar1 = (s->_M_dataplus)._M_p[uVar15 + uVar13];
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          uVar3 = 0;
          uVar14 = 0;
          break;
        }
        uVar3 = (uint)(byte)(cVar1 - 0x30) + (int)uVar8 * 10;
        uVar8 = (ulong)uVar3;
        uVar15 = uVar15 + 1;
      } while ((uVar15 & 0xffffffff) < uVar5 - uVar13);
      uVar8 = uVar3 | uVar14;
    }
    if ((uVar2 == 0) || (uVar2 < uVar17)) goto LAB_001a853e;
    uVar3 = 0;
    uVar13 = 1;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar13 + uVar5];
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001a853e;
      uVar3 = (uint)(byte)(cVar1 - 0x30) + uVar3 * 10;
      uVar17 = uVar13 & 0xffffffff;
      uVar13 = uVar13 + 1;
    } while (uVar17 < uVar10);
    if (((uVar8 >> 0x20 == 0) || (uVar6 = (uint)uVar8, uVar6 == 0)) || (uVar3 == 0))
    goto LAB_001a853e;
    iVar12 = 0;
    if (uVar3 <= uVar6) {
      uVar13 = uVar8 & 0xffffffff;
      uVar6 = uVar6 + (int)(uVar13 / 10) * -10;
      uVar8 = (ulong)uVar6;
      if (uVar6 == 0) goto LAB_001a853e;
      iVar12 = (int)(uVar13 / 10) * 10000;
    }
    uVar3 = (uint)((int)uVar8 * 10000) / uVar3 + iVar12;
  }
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = MVar16;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)uVar3 | 0x100000000);
LAB_001a8492:
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit = STATUTE_MILES;
  (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::Distance>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Distance> Distance::fromMileString(const std::string & s, 
	bool remarkFormat)
{
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?SM|////SM");
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?");
	static const std::optional<Distance> error;
	static const auto unitStr = std::string ("SM");
	static const auto unitLength = unitStr.length();

	Distance distance;
	distance.distUnit = Unit::STATUTE_MILES;
	if (!remarkFormat) {
		if (s.length() < unitLength + 1) return error; //1 digit minimum
		if (s == "////SM") return distance;
		if (s.substr(s.length() - unitLength, unitLength) != unitStr) return error; //s.endsWith(unitStr)
	} else {
		if (s.length() < 1) return error; //1 digit minimum
	}
	const auto modifier = modifierFromChar(s[0]);
	if (modifier.has_value()) {
		distance.distModifier = *modifier;
	}

	if (s.find('/') == std::string::npos) {
		//The value is integer, e.g. 3SM or 15SM
		const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t intLength = s.length() -
			(remarkFormat ? 0 : unitLength) -
            intPos;
		static const int minDigits = 1, maxDigits = 2;
		if (intLength < minDigits || intLength > maxDigits) return error;
		const auto dist = strToUint(s, intPos, intLength);
		if (!dist.has_value()) return error;
		distance.dist = *dist * statuteMileFactor;
	} else {
		//Fraction value, e.g. 1/2SM, 11/2SM, 5/16SM, 11/16SM
        const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t fracLength = s.length() -
			(remarkFormat ? 0: unitLength) -
			intPos;
		const auto fraction = fractionStrToUint(s,
                                                intPos,
                                                fracLength);
		if (!fraction.has_value()) return error;
		auto integer = 0u;
		auto numerator = std::get<0>(*fraction);
		auto denominator = std::get<1>(*fraction);
		if (!numerator || !denominator) return error;
		if (numerator >= denominator) { //e.g. 11/2SM = 1 1/2SM
			static const auto decimalRadix = 10u;
			integer = numerator / decimalRadix;
			numerator = numerator % decimalRadix;
		}
		if (!numerator) return error;
		distance.dist = 
			integer * statuteMileFactor + 
			numerator * statuteMileFactor / denominator;
	}
	return distance;
}